

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 MemObjStringValue(SyBlob *pOut,jx9_value *pObj)

{
  jx9_value *pObj_local;
  SyBlob *pOut_local;
  
  if ((pObj->iFlags & 4U) == 0) {
    if ((pObj->iFlags & 2U) == 0) {
      if ((pObj->iFlags & 8U) == 0) {
        if ((pObj->iFlags & 0x40U) == 0) {
          if ((pObj->iFlags & 0x100U) != 0) {
            SyBlobFormat(pOut,"ResourceID_%#x",(pObj->x).rVal);
          }
        }
        else {
          jx9JsonSerialize(pObj,pOut);
          jx9HashmapUnref((jx9_hashmap *)(pObj->x).pOther);
        }
      }
      else if ((pObj->x).iVal == 0) {
        SyBlobAppend(pOut,"false",5);
      }
      else {
        SyBlobAppend(pOut,"true",4);
      }
    }
    else {
      SyBlobFormat(pOut,"%qd",(pObj->x).rVal);
    }
  }
  else {
    SyBlobFormat(pOut,"%.15g",(pObj->x).rVal);
  }
  return 0;
}

Assistant:

static sxi32 MemObjStringValue(SyBlob *pOut,jx9_value *pObj)
{
	if( pObj->iFlags & MEMOBJ_REAL ){
		SyBlobFormat(&(*pOut), "%.15g", pObj->x.rVal);
	}else if( pObj->iFlags & MEMOBJ_INT ){
		SyBlobFormat(&(*pOut), "%qd", pObj->x.iVal);
		/* %qd (BSD quad) is equivalent to %lld in the libc printf */
	}else if( pObj->iFlags & MEMOBJ_BOOL ){
		if( pObj->x.iVal ){
			SyBlobAppend(&(*pOut),"true", sizeof("true")-1);
		}else{
			SyBlobAppend(&(*pOut),"false", sizeof("false")-1);
		}
	}else if( pObj->iFlags & MEMOBJ_HASHMAP ){
		/* Serialize JSON object or array */
		jx9JsonSerialize(pObj,pOut);
		jx9HashmapUnref((jx9_hashmap *)pObj->x.pOther);
	}else if(pObj->iFlags & MEMOBJ_RES ){
		SyBlobFormat(&(*pOut), "ResourceID_%#x", pObj->x.pOther);
	}
	return SXRET_OK;
}